

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::Boxed_Number::go<unsigned_long,double>
          (Boxed_Number *this,Opers t_oper,Boxed_Value *t_bv,unsigned_long *t_lhs,
          unsigned_long *c_lhs,double *c_rhs)

{
  unsigned_long uVar1;
  bad_any_cast *this_00;
  ulong uVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  Boxed_Value BVar19;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double *local_38;
  double *c_rhs_local;
  unsigned_long *c_lhs_local;
  unsigned_long *t_lhs_local;
  Boxed_Value *t_bv_local;
  Boxed_Number *pBStack_10;
  Opers t_oper_local;
  
  local_38 = c_rhs;
  c_rhs_local = (double *)c_lhs;
  c_lhs_local = t_lhs;
  t_lhs_local = (unsigned_long *)t_bv;
  t_bv_local._4_4_ = t_oper;
  pBStack_10 = this;
  switch(t_oper) {
  case equals:
    uVar1 = *c_lhs;
    auVar5._8_4_ = (int)(uVar1 >> 0x20);
    auVar5._0_8_ = uVar1;
    auVar5._12_4_ = 0x45300000;
    BVar19 = const_var((chaiscript *)this,
                       (auVar5._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0) == *c_rhs);
    _Var3._M_pi = BVar19.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case less_than:
    uVar1 = *c_lhs;
    auVar17._8_4_ = (int)(uVar1 >> 0x20);
    auVar17._0_8_ = uVar1;
    auVar17._12_4_ = 0x45300000;
    BVar19 = const_var((chaiscript *)this,
                       (auVar17._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0) < *c_rhs);
    _Var3._M_pi = BVar19.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case greater_than:
    uVar1 = *c_lhs;
    auVar6._8_4_ = (int)(uVar1 >> 0x20);
    auVar6._0_8_ = uVar1;
    auVar6._12_4_ = 0x45300000;
    dVar4 = (auVar6._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
    BVar19 = const_var((chaiscript *)this,*c_rhs <= dVar4 && dVar4 != *c_rhs);
    _Var3._M_pi = BVar19.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case less_than_equal:
    uVar1 = *c_lhs;
    auVar18._8_4_ = (int)(uVar1 >> 0x20);
    auVar18._0_8_ = uVar1;
    auVar18._12_4_ = 0x45300000;
    BVar19 = const_var((chaiscript *)this,
                       (auVar18._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0) <= *c_rhs);
    _Var3._M_pi = BVar19.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case greater_than_equal:
    uVar1 = *c_lhs;
    auVar7._8_4_ = (int)(uVar1 >> 0x20);
    auVar7._0_8_ = uVar1;
    auVar7._12_4_ = 0x45300000;
    BVar19 = const_var((chaiscript *)this,
                       *c_rhs <= (auVar7._8_8_ - 1.9342813113834067e+25) +
                                 ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
    _Var3._M_pi = BVar19.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case not_equal:
    uVar1 = *c_lhs;
    auVar8._8_4_ = (int)(uVar1 >> 0x20);
    auVar8._0_8_ = uVar1;
    auVar8._12_4_ = 0x45300000;
    BVar19 = const_var((chaiscript *)this,
                       (auVar8._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0) != *c_rhs);
    _Var3._M_pi = BVar19.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  default:
    if (t_lhs == (unsigned_long *)0x0) {
LAB_0066e0ba:
      this_00 = (bad_any_cast *)__cxa_allocate_exception(8);
      memset(this_00,0,8);
      detail::exception::bad_any_cast::bad_any_cast(this_00);
      __cxa_throw(this_00,&detail::exception::bad_any_cast::typeinfo,
                  detail::exception::bad_any_cast::~bad_any_cast);
    }
    switch(t_oper) {
    case assign:
      uVar2 = (ulong)*c_rhs;
      *t_lhs = uVar2 | (long)(*c_rhs - 9.223372036854776e+18) & (long)uVar2 >> 0x3f;
      Boxed_Value::Boxed_Value(&this->bv,t_bv);
      _Var3._M_pi = extraout_RDX;
      break;
    default:
      goto LAB_0066e0ba;
    case assign_product:
      uVar1 = *t_lhs;
      auVar13._8_4_ = (int)(uVar1 >> 0x20);
      auVar13._0_8_ = uVar1;
      auVar13._12_4_ = 0x45300000;
      dVar4 = ((auVar13._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * *c_rhs;
      uVar2 = (ulong)dVar4;
      *t_lhs = uVar2 | (long)(dVar4 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f;
      Boxed_Value::Boxed_Value(&this->bv,t_bv);
      _Var3._M_pi = extraout_RDX_00;
      break;
    case assign_sum:
      uVar1 = *t_lhs;
      auVar14._8_4_ = (int)(uVar1 >> 0x20);
      auVar14._0_8_ = uVar1;
      auVar14._12_4_ = 0x45300000;
      dVar4 = (auVar14._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0) + *c_rhs;
      uVar2 = (ulong)dVar4;
      *t_lhs = uVar2 | (long)(dVar4 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f;
      Boxed_Value::Boxed_Value(&this->bv,t_bv);
      _Var3._M_pi = extraout_RDX_01;
      break;
    case assign_quotient:
      check_divide_by_zero<double>(*c_rhs);
      uVar1 = *c_lhs_local;
      auVar15._8_4_ = (int)(uVar1 >> 0x20);
      auVar15._0_8_ = uVar1;
      auVar15._12_4_ = 0x45300000;
      dVar4 = ((auVar15._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) / *local_38;
      uVar2 = (ulong)dVar4;
      *c_lhs_local = uVar2 | (long)(dVar4 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f;
      Boxed_Value::Boxed_Value(&this->bv,(Boxed_Value *)t_lhs_local);
      _Var3._M_pi = extraout_RDX_02;
      break;
    case assign_difference:
      uVar1 = *t_lhs;
      auVar16._8_4_ = (int)(uVar1 >> 0x20);
      auVar16._0_8_ = uVar1;
      auVar16._12_4_ = 0x45300000;
      dVar4 = ((auVar16._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) - *c_rhs;
      uVar2 = (ulong)dVar4;
      *t_lhs = uVar2 | (long)(dVar4 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f;
      Boxed_Value::Boxed_Value(&this->bv,t_bv);
      _Var3._M_pi = extraout_RDX_03;
    }
    break;
  case sum:
    uVar1 = *c_lhs;
    auVar9._8_4_ = (int)(uVar1 >> 0x20);
    auVar9._0_8_ = uVar1;
    auVar9._12_4_ = 0x45300000;
    local_40 = (auVar9._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0) + *c_rhs;
    BVar19 = const_var<double>((chaiscript *)this,&local_40);
    _Var3._M_pi = BVar19.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case quotient:
    check_divide_by_zero<double>(*c_rhs);
    dVar4 = *c_rhs_local;
    auVar10._8_4_ = (int)((ulong)dVar4 >> 0x20);
    auVar10._0_8_ = dVar4;
    auVar10._12_4_ = 0x45300000;
    local_48 = ((auVar10._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,SUB84(dVar4,0)) - 4503599627370496.0)) / *local_38;
    BVar19 = const_var<double>((chaiscript *)this,&local_48);
    _Var3._M_pi = BVar19.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case product:
    uVar1 = *c_lhs;
    auVar11._8_4_ = (int)(uVar1 >> 0x20);
    auVar11._0_8_ = uVar1;
    auVar11._12_4_ = 0x45300000;
    local_50 = ((auVar11._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * *c_rhs;
    BVar19 = const_var<double>((chaiscript *)this,&local_50);
    _Var3._M_pi = BVar19.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case difference:
    uVar1 = *c_lhs;
    auVar12._8_4_ = (int)(uVar1 >> 0x20);
    auVar12._0_8_ = uVar1;
    auVar12._12_4_ = 0x45300000;
    local_58 = ((auVar12._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) - *c_rhs;
    BVar19 = const_var<double>((chaiscript *)this,&local_58);
    _Var3._M_pi = BVar19.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  BVar19.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var3._M_pi;
  BVar19.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar19.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

static auto go(Operators::Opers t_oper, const Boxed_Value &t_bv, LHS *t_lhs, const LHS &c_lhs, const RHS &c_rhs) {
      switch (t_oper) {
        case Operators::Opers::equals:
          return const_var(c_lhs == c_rhs);
        case Operators::Opers::less_than:
          return const_var(c_lhs < c_rhs);
        case Operators::Opers::greater_than:
          return const_var(c_lhs > c_rhs);
        case Operators::Opers::less_than_equal:
          return const_var(c_lhs <= c_rhs);
        case Operators::Opers::greater_than_equal:
          return const_var(c_lhs >= c_rhs);
        case Operators::Opers::not_equal:
          return const_var(c_lhs != c_rhs);
        case Operators::Opers::sum:
          return const_var(c_lhs + c_rhs);
        case Operators::Opers::quotient:
          check_divide_by_zero(c_rhs);
          return const_var(c_lhs / c_rhs);
        case Operators::Opers::product:
          return const_var(c_lhs * c_rhs);
        case Operators::Opers::difference:
          return const_var(c_lhs - c_rhs);
        default:
          break;
      }

      if constexpr (!std::is_floating_point<LHS>::value && !std::is_floating_point<RHS>::value) {
        switch (t_oper) {
          case Operators::Opers::shift_left:
            return const_var(c_lhs << c_rhs);
          case Operators::Opers::shift_right:
            return const_var(c_lhs >> c_rhs);
          case Operators::Opers::remainder:
            check_divide_by_zero(c_rhs);
            return const_var(c_lhs % c_rhs);
          case Operators::Opers::bitwise_and:
            return const_var(c_lhs & c_rhs);
          case Operators::Opers::bitwise_or:
            return const_var(c_lhs | c_rhs);
          case Operators::Opers::bitwise_xor:
            return const_var(c_lhs ^ c_rhs);
          default:
            break;
        }
      }

      if (t_lhs) {
        switch (t_oper) {
          case Operators::Opers::assign:
            *t_lhs = c_rhs;
            return t_bv;
          case Operators::Opers::assign_product:
            *t_lhs *= c_rhs;
            return t_bv;
          case Operators::Opers::assign_sum:
            *t_lhs += c_rhs;
            return t_bv;
          case Operators::Opers::assign_quotient:
            check_divide_by_zero(c_rhs);
            *t_lhs /= c_rhs;
            return t_bv;
          case Operators::Opers::assign_difference:
            *t_lhs -= c_rhs;
            return t_bv;
          default:
            break;
        }

        if constexpr (!std::is_floating_point<LHS>::value && !std::is_floating_point<RHS>::value) {
          switch (t_oper) {
            case Operators::Opers::assign_bitwise_and:
              check_divide_by_zero(c_rhs);
              *t_lhs &= c_rhs;
              return t_bv;
            case Operators::Opers::assign_bitwise_or:
              *t_lhs |= c_rhs;
              return t_bv;
            case Operators::Opers::assign_shift_left:
              *t_lhs <<= c_rhs;
              return t_bv;
            case Operators::Opers::assign_shift_right:
              *t_lhs >>= c_rhs;
              return t_bv;
            case Operators::Opers::assign_remainder:
              *t_lhs %= c_rhs;
              return t_bv;
            case Operators::Opers::assign_bitwise_xor:
              *t_lhs ^= c_rhs;
              return t_bv;
            default:
              break;
          }
        }
      }

      throw chaiscript::detail::exception::bad_any_cast();
    }